

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

Float __thiscall pbrt::Disk::PDF(Disk *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar4;
  int iVar5;
  ShapeIntersection *p2;
  long *in_FS_OFFSET;
  Float FVar6;
  type tVar7;
  float fVar8;
  undefined8 uVar10;
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  Vector3<float> VVar12;
  Point3f PVar13;
  Float in_stack_0000002c;
  Ray *in_stack_00000030;
  Disk *in_stack_00000038;
  Float pdf;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined1 in_stack_fffffffffffffdd8 [16];
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  ShapeSampleContext *in_stack_fffffffffffffdf8;
  float local_16c;
  _lambda_pbrt__StatsAccumulator___1_ local_151;
  optional<pbrt::ShapeIntersection> local_150;
  float local_4;
  undefined1 auVar11 [56];
  
  ShapeSampleContext::SpawnRay
            (in_stack_fffffffffffffdf8,
             (Vector3f *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  Intersect(in_stack_00000038,in_stack_00000030,in_stack_0000002c);
  if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
     (iVar5 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::
                                   reg), iVar5 != 0)) {
    PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3_const&)_const::
    {lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer(&local_151);
    StatRegisterer::StatRegisterer
              (in_stack_fffffffffffffdd8._8_8_,in_stack_fffffffffffffdd8._0_8_,
               (PixelAccumFunc)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
  }
  *(long *)(*in_FS_OFFSET + -0x168) = *(long *)(*in_FS_OFFSET + -0x168) + 1;
  bVar3 = pstd::optional<pbrt::ShapeIntersection>::has_value(&local_150);
  if (!bVar3) {
    *(long *)(*in_FS_OFFSET + -0x170) = *(long *)(*in_FS_OFFSET + -0x170) + 1;
  }
  bVar3 = pstd::optional::operator_cast_to_bool((optional *)&local_150);
  if (bVar3) {
    FVar6 = Area((Disk *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    uVar10 = 0;
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x7efa02);
    VVar12 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    auVar2._8_8_ = uVar10;
    auVar2._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    vmovlpd_avx(auVar2);
    tVar7 = AbsDot<float>((Normal3<float> *)
                          CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                          (Vector3<float> *)
                          CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    auVar11 = extraout_var;
    PVar13 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    fVar8 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    auVar9._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar9._8_56_ = auVar11;
    uVar10 = 0;
    vmovlpd_avx(auVar9._0_16_);
    p2 = pstd::optional<pbrt::ShapeIntersection>::operator->
                   ((optional<pbrt::ShapeIntersection> *)0x7efaec);
    PVar13 = Interaction::p((Interaction *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    auVar1._8_8_ = uVar10;
    auVar1._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar1);
    fVar8 = DistanceSquared<float>
                      ((Point3<float> *)CONCAT44(fVar8,in_stack_fffffffffffffdd0),
                       (Point3<float> *)p2);
    local_16c = (1.0 / FVar6) / (tVar7 / fVar8);
    eVar4 = IsInf<float>(0.0);
    if (eVar4) {
      local_16c = 0.0;
    }
    local_4 = local_16c;
  }
  else {
    local_4 = 0.0;
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional((optional<pbrt::ShapeIntersection> *)0x7efbdc);
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
        // Intersect sample ray with shape geometry
        Ray ray = ctx.SpawnRay(wi);
        pstd::optional<ShapeIntersection> isect = Intersect(ray);
        CHECK_RARE(1e-6, !isect.has_value());
        if (!isect)
            return 0;

        // Compute PDF in solid angle measure from shape intersection point
        Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                    DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;

        return pdf;
    }